

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * __thiscall
MakefileGenerator::fileFixify
          (QString *__return_storage_ptr__,MakefileGenerator *this,QString *file,FileFixifyTypes fix
          ,bool canon)

{
  QMakeLocalFileName *pQVar1;
  QMakeProject *pQVar2;
  Data *pDVar3;
  QString file_00;
  QString file_01;
  QString file_02;
  QString file_03;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QHash<QString,_bool> QVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  char cVar10;
  bool bVar11;
  uint uVar12;
  qsizetype qVar13;
  ulong n;
  QArrayDataPointer<char16_t> *pQVar14;
  uint uVar15;
  int iVar16;
  QMakeProject *pQVar17;
  int iVar18;
  long in_FS_OFFSET;
  QFlagsStorage<MakefileGenerator::FileFixifyType> QVar19;
  undefined8 in_stack_fffffffffffffe50;
  QString *in_stack_fffffffffffffe58;
  QFileInfo in_fi;
  QMakeProject *pQStack_190;
  QMakeLocalFileName *local_188;
  undefined1 local_168 [40];
  undefined8 local_140;
  Data *pDStack_138;
  QFileInfo qfileinfo;
  QFileInfo out_fi;
  SourceFiles *pSStack_120;
  QArrayDataPointer<char16_t> local_110;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  undefined1 local_c8 [32];
  QFileInfo in_fi_1;
  QMakeProject *pQStack_a0;
  QMakeLocalFileName *local_98;
  ProString local_88;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((file->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&file->d);
      return __return_storage_ptr__;
    }
    goto LAB_0013f0cb;
  }
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&file->d);
  local_50.d = (__return_storage_ptr__->d).d;
  local_50.ptr = (__return_storage_ptr__->d).ptr;
  local_50.size = (__return_storage_ptr__->d).size;
  if ((QMakeProject *)local_50.d != (QMakeProject *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(((QMakeProject *)local_50.d)->super_QMakeEvaluator).m_caller)->_q_value).
    super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(((QMakeProject *)local_50.d)->super_QMakeEvaluator).m_caller)->
         _q_value).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  cVar10 = QString::startsWith((QChar)(char16_t)__return_storage_ptr__,0x7e);
  QVar19.i = (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                  super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
  if (cVar10 != '\0') {
    qVar13 = QtPrivate::lengthHelperPointer<char>("~/");
    cVar10 = QString::startsWith((QLatin1String *)__return_storage_ptr__,(CaseSensitivity)qVar13);
    if (cVar10 == '\0') {
      QString::toLatin1_helper((QString *)&local_88);
      pQVar17 = (QMakeProject *)local_88.m_string.d.ptr;
      if ((QMakeProject *)local_88.m_string.d.ptr == (QMakeProject *)0x0) {
        pQVar17 = (QMakeProject *)&QByteArray::_empty;
      }
      warn_msg(WarnLogic,"Unable to expand ~ in %s",pQVar17);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
    }
    else {
      QDir::homePath();
      QString::mid((longlong)local_c8,(longlong)__return_storage_ptr__);
      QStringBuilder<QString,_QString>::QStringBuilder
                ((QStringBuilder<QString,_QString> *)&local_88,(QString *)&in_fi_1,
                 (QString *)local_c8);
      QStringBuilder<QString,_QString>::convertTo<QString>
                ((QString *)&in_fi,(QStringBuilder<QString,_QString> *)&local_88);
      pDVar3 = (Data *)(__return_storage_ptr__->d).d;
      pQVar17 = (QMakeProject *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = (Data *)_in_fi;
      (__return_storage_ptr__->d).ptr = (char16_t *)pQStack_190;
      pQVar1 = (QMakeLocalFileName *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = (qsizetype)local_188;
      _in_fi = pDVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&in_fi);
      fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
      super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
           (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)
           (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)QVar19.i;
      QStringBuilder<QString,_QString>::~QStringBuilder
                ((QStringBuilder<QString,_QString> *)&local_88);
      QVar19.i = (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                      super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&in_fi_1);
      pQStack_190 = pQVar17;
      local_188 = pQVar1;
    }
  }
  uVar15 = (uint)canon;
  if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
             super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 4) == 0) {
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 8) == 0) {
      pQVar17 = this->project;
      QString::QString((QString *)&local_88,"no_fixpath");
      fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
      super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
           (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)
           (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)QVar19.i;
      bVar11 = QMakeProject::isActiveConfig(pQVar17,(QString *)&local_88,false);
      QVar19.i = (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                      super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      if (bVar11) goto LAB_0013eccc;
    }
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 2) == 0) {
      pQStack_a0 = (QMakeProject *)Option::output_dir.d.ptr;
      local_98 = (QMakeLocalFileName *)Option::output_dir.d.size;
      _in_fi_1 = (Data *)Option::output_dir.d.d;
    }
    else {
      pQVar17 = this->project;
      _in_fi_1 = (Data *)(pQVar17->m_projectDir).d.d;
      pQStack_a0 = (QMakeProject *)(pQVar17->m_projectDir).d.ptr;
      local_98 = (QMakeLocalFileName *)(pQVar17->m_projectDir).d.size;
    }
    pQVar17 = pQStack_a0;
    if ((Data *)_in_fi_1 != (Data *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((Data *)_in_fi_1)->ref)->d =
           *(int *)&((DataPointer *)&((Data *)_in_fi_1)->ref)->d + 1;
      UNLOCK();
    }
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 1) == 0) {
      pQVar2 = this->project;
      local_c8._8_8_ = (pQVar2->m_projectDir).d.ptr;
      local_c8._16_8_ = (pQVar2->m_projectDir).d.size;
      local_f8.d = (Data *)(pQVar2->m_projectDir).d.d;
    }
    else {
      local_c8._8_8_ = Option::output_dir.d.ptr;
      local_c8._16_8_ = Option::output_dir.d.size;
      local_f8.d = Option::output_dir.d.d;
    }
    if ((Data *)local_f8.d != (Data *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((Data *)local_f8.d)->ref)->d =
           *(int *)&((DataPointer *)&((Data *)local_f8.d)->ref)->d + 1;
      UNLOCK();
    }
    _in_fi = (Data *)0xaaaaaaaaaaaaaaaa;
    local_f8.ptr = (char16_t *)local_c8._8_8_;
    local_f8.size = local_c8._16_8_;
    if ((Data *)local_f8.d != (Data *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((Data *)local_f8.d)->ref)->d =
           *(int *)&((DataPointer *)&((Data *)local_f8.d)->ref)->d + 1;
      UNLOCK();
    }
    file_00.d.d._4_4_ = QVar19.i;
    file_00.d.d._0_4_ = uVar15;
    file_00.d.ptr = (char16_t *)in_stack_fffffffffffffe50;
    file_00.d.size = (qsizetype)in_stack_fffffffffffffe58;
    local_c8._0_8_ = local_f8.d;
    fileInfo((MakefileGenerator *)&in_fi,file_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    cVar10 = QFileInfo::exists();
    if (cVar10 != '\0') {
      QFileInfo::canonicalFilePath();
      uVar6 = local_c8._16_8_;
      uVar5 = local_c8._8_8_;
      uVar4 = local_c8._0_8_;
      local_c8._0_8_ = local_88.m_string.d.d;
      local_c8._8_8_ = local_88.m_string.d.ptr;
      local_88.m_string.d.d = (Data *)uVar4;
      local_88.m_string.d.ptr = (char16_t *)uVar5;
      local_c8._16_8_ = local_88.m_string.d.size;
      local_88.m_string.d.size = uVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    }
    _out_fi = (Span *)0xaaaaaaaaaaaaaaaa;
    local_110.d = (Data *)_in_fi_1;
    local_110.ptr = (char16_t *)pQStack_a0;
    local_110.size = (qsizetype)local_98;
    if ((Data *)_in_fi_1 != (Data *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&_in_fi_1->ref)->d = *(int *)&((DataPointer *)&_in_fi_1->ref)->d + 1;
      UNLOCK();
    }
    file_01.d.d._4_4_ = QVar19.i;
    file_01.d.d._0_4_ = uVar15;
    file_01.d.ptr = (char16_t *)in_stack_fffffffffffffe50;
    file_01.d.size = (qsizetype)in_stack_fffffffffffffe58;
    fileInfo((MakefileGenerator *)&out_fi,file_01);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
    cVar10 = QFileInfo::exists();
    if (cVar10 != '\0') {
      QFileInfo::canonicalFilePath();
      QVar7.d = _in_fi_1;
      _in_fi_1 = (Data *)local_88.m_string.d.d;
      pQStack_a0 = (QMakeProject *)local_88.m_string.d.ptr;
      local_88.m_string.d.d = (Data *)QVar7.d;
      local_88.m_string.d.ptr = (char16_t *)pQVar17;
      local_88.m_string.d.size = (qsizetype)local_98;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    }
    QFileInfo::~QFileInfo(&out_fi);
    QFileInfo::~QFileInfo(&in_fi);
    _out_fi = (Span *)0xaaaaaaaaaaaaaaaa;
    pSStack_120 = (SourceFiles *)0xaaaaaaaaaaaaaaaa;
    Option::normalizePath((QString *)&out_fi,__return_storage_ptr__,true,true);
    _qfileinfo = (_func_int **)0xaaaaaaaaaaaaaaaa;
    local_168._32_8_ = _out_fi;
    local_140._0_4_ = -0x55555556;
    local_140._4_4_ = 0xaaaaaaaa;
    pDStack_138 = (Data *)0xaaaaaaaaaaaaaaaa;
    if (_out_fi != (Span *)0x0) {
      LOCK();
      (((QArrayData *)_out_fi->offsets)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)_out_fi->offsets)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    file_02.d.d._4_4_ = QVar19.i;
    file_02.d.d._0_4_ = uVar15;
    file_02.d.ptr = (char16_t *)in_stack_fffffffffffffe50;
    file_02.d.size = (qsizetype)in_stack_fffffffffffffe58;
    fileInfo((MakefileGenerator *)&qfileinfo,file_02);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_168 + 0x20));
    bVar11 = operator!=((QString *)&in_fi_1,(QString *)local_c8);
    if ((bVar11) || (cVar10 = QFileInfo::isRelative(), cVar10 == '\0')) {
      cVar10 = QFileInfo::isRelative();
      if (cVar10 != '\0') {
        pQStack_190 = (QMakeProject *)0x218d3b;
        _in_fi = (Data *)local_c8;
        QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::convertTo<QString>
                  ((QString *)&local_88,
                   (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)&in_fi
                  );
        pDVar3 = (Data *)(__return_storage_ptr__->d).d;
        pQVar17 = (QMakeProject *)(__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = local_88.m_string.d.d;
        (__return_storage_ptr__->d).ptr = local_88.m_string.d.ptr;
        pQVar1 = (QMakeLocalFileName *)(__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_88.m_string.d.size;
        local_88.m_string.d.d = (Data *)pDVar3;
        local_88.m_string.d.ptr = (char16_t *)pQVar17;
        local_88.m_string.d.size = (qsizetype)pQVar1;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
        QFileInfo::setFile((QString *)&qfileinfo);
        local_188 = (QMakeLocalFileName *)&out_fi;
      }
      bVar11 = SUB41(uVar15,0);
      Option::fixPathToTargetOS((QString *)&local_88,__return_storage_ptr__,false,bVar11);
      pDVar3 = (Data *)(__return_storage_ptr__->d).d;
      pQVar17 = (QMakeProject *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_88.m_string.d.d;
      (__return_storage_ptr__->d).ptr = local_88.m_string.d.ptr;
      pQVar1 = (QMakeLocalFileName *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_88.m_string.d.size;
      local_88.m_string.d.d = (Data *)pDVar3;
      local_88.m_string.d.ptr = (char16_t *)pQVar17;
      local_88.m_string.d.size = (qsizetype)pQVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      local_168._16_8_ = (QMakeLocalFileName *)0xaaaaaaaaaaaaaaaa;
      local_168._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
      local_168._8_8_ = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
      Option::fixPathToTargetOS((QString *)local_168,(QString *)&in_fi_1,false,bVar11);
      bVar11 = comparesEqual(__return_storage_ptr__,(QString *)local_168);
      if (bVar11) {
        QString::operator=(__return_storage_ptr__,"");
      }
      else {
        pQStack_190 = (QMakeProject *)&Option::dir_sep;
        _in_fi = (Data *)local_168;
        QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                  ((QString *)&local_88,(QStringBuilder<QString_&,_QString_&> *)&in_fi);
        cVar10 = QString::startsWith((QString *)__return_storage_ptr__,
                                     (CaseSensitivity)(QArrayDataPointer<char16_t> *)&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
        if (cVar10 == '\0') {
          if ((Option::qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
            pQVar17 = this->project;
            if (pQVar17 != (QMakeProject *)0x0) {
              ProKey::ProKey((ProKey *)&local_88,"QMAKE_PROJECT_DEPTH");
              bVar11 = QMakeProject::isEmpty(pQVar17,(ProKey *)&local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_88);
              if (!bVar11) {
                pQVar17 = this->project;
                ProKey::ProKey((ProKey *)&in_fi,"QMAKE_PROJECT_DEPTH");
                QMakeEvaluator::first(&local_88,&pQVar17->super_QMakeEvaluator,(ProKey *)&in_fi);
                iVar16 = ProString::toInt(&local_88,(bool *)0x0,10);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_88);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&in_fi);
                goto LAB_0013edcb;
              }
            }
            iVar16 = 4;
            if (Option::mkfile::cachefile_depth != -1) {
              iVar16 = Option::mkfile::cachefile_depth;
            }
          }
          else {
            iVar16 = 4;
          }
LAB_0013edcb:
          local_88.m_string.d.d = (Data *)0x0;
          local_88.m_string.d.ptr = (char16_t *)0x0;
          local_88.m_string.d.size = 0;
          iVar18 = 0;
          if (0 < iVar16) {
            iVar18 = iVar16;
          }
          iVar16 = 1;
LAB_0013edf6:
          if (iVar16 - iVar18 != 1) {
            qVar13 = QString::lastIndexOf((QString *)local_168,&Option::dir_sep,CaseSensitive);
            if ((int)qVar13 != -1) {
              QString::left((QString *)&in_fi,(QString *)local_168,(long)(int)qVar13);
              uVar6 = local_168._16_8_;
              uVar5 = local_168._8_8_;
              uVar4 = local_168._0_8_;
              local_168._0_8_ = _in_fi;
              local_168._8_8_ = pQStack_190;
              _in_fi = (Data *)uVar4;
              pQStack_190 = (QMakeProject *)uVar5;
              local_168._16_8_ = local_188;
              local_188 = (QMakeLocalFileName *)uVar6;
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&in_fi)
              ;
              if ((QMakeLocalFileName *)local_168._16_8_ != (QMakeLocalFileName *)0x0) {
                QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                          ((QString *)&in_fi,
                           (QStringBuilder<QString_&,_QString_&> *)&stack0xfffffffffffffe58);
                cVar10 = QString::startsWith((QString *)__return_storage_ptr__,
                                             (CaseSensitivity)(QArrayDataPointer<char16_t> *)&in_fi)
                ;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&in_fi);
                if (cVar10 == '\0') goto code_r0x0013ee9f;
                uVar12 = ~local_168._16_4_ + (int)(__return_storage_ptr__->d).size;
                n = 0;
                if (0 < (int)uVar12) {
                  n = (ulong)uVar12;
                }
                QString::right((QString *)&in_fi,__return_storage_ptr__,n);
                pDVar3 = (Data *)(__return_storage_ptr__->d).d;
                pQStack_190 = (QMakeProject *)(__return_storage_ptr__->d).ptr;
                (__return_storage_ptr__->d).d = (Data *)_in_fi;
                (__return_storage_ptr__->d).ptr = (char16_t *)uVar5;
                (__return_storage_ptr__->d).size = uVar6;
                _in_fi = pDVar3;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&in_fi);
                while (bVar11 = iVar16 != 0, iVar16 = iVar16 + -1, bVar11) {
                  _in_fi = (Data *)0x220ac4;
                  pQStack_190 = (QMakeProject *)&Option::dir_sep;
                  ::operator+=(&local_88.m_string,
                               (QStringBuilder<const_char_(&)[3],_QString_&> *)&in_fi);
                }
              }
            }
          }
          QString::prepend(__return_storage_ptr__,&local_88.m_string);
          goto LAB_0013ef33;
        }
        QString::mid((longlong)&local_88,(longlong)__return_storage_ptr__);
        pDVar3 = (Data *)(__return_storage_ptr__->d).d;
        pQVar17 = (QMakeProject *)(__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = local_88.m_string.d.d;
        (__return_storage_ptr__->d).ptr = local_88.m_string.d.ptr;
        pQVar1 = (QMakeLocalFileName *)(__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_88.m_string.d.size;
        local_88.m_string.d.d = (Data *)pDVar3;
        local_88.m_string.d.ptr = (char16_t *)pQVar17;
        local_88.m_string.d.size = (qsizetype)pQVar1;
LAB_0013ef33:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      }
      pQVar14 = (QArrayDataPointer<char16_t> *)local_168;
    }
    else {
      pQVar14 = (QArrayDataPointer<char16_t> *)&local_88;
      Option::fixPathToTargetOS((QString *)pQVar14,__return_storage_ptr__,false,SUB41(uVar15,0));
      pDVar3 = (Data *)(__return_storage_ptr__->d).d;
      pQVar17 = (QMakeProject *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_88.m_string.d.d;
      (__return_storage_ptr__->d).ptr = local_88.m_string.d.ptr;
      pQVar1 = (QMakeLocalFileName *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_88.m_string.d.size;
      local_88.m_string.d.d = (Data *)pDVar3;
      local_88.m_string.d.ptr = (char16_t *)pQVar17;
      local_88.m_string.d.size = (qsizetype)pQVar1;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar14);
    QFileInfo::~QFileInfo(&qfileinfo);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&out_fi);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
    pQVar14 = (QArrayDataPointer<char16_t> *)&in_fi_1;
  }
  else {
    cVar10 = QDir::isRelativePath((QString *)__return_storage_ptr__);
    if (cVar10 != '\0') {
      if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                 super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 1) == 0) {
        pQVar17 = this->project;
        local_88.m_string.d.ptr = (pQVar17->m_projectDir).d.ptr;
        local_88.m_string.d.size = (pQVar17->m_projectDir).d.size;
        local_e0.d = (Data *)(pQVar17->m_projectDir).d.d;
      }
      else {
        local_88.m_string.d.ptr = Option::output_dir.d.ptr;
        local_88.m_string.d.size = Option::output_dir.d.size;
        local_e0.d = Option::output_dir.d.d;
      }
      if ((Data *)local_e0.d != (Data *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((Data *)local_e0.d)->ref)->d =
             *(int *)&((DataPointer *)&((Data *)local_e0.d)->ref)->d + 1;
        UNLOCK();
      }
      _in_fi_1 = (Data *)0xaaaaaaaaaaaaaaaa;
      local_e0.ptr = local_88.m_string.d.ptr;
      local_e0.size = local_88.m_string.d.size;
      if ((Data *)local_e0.d != (Data *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((Data *)local_e0.d)->ref)->d =
             *(int *)&((DataPointer *)&((Data *)local_e0.d)->ref)->d + 1;
        UNLOCK();
      }
      file_03.d.d._4_4_ = QVar19.i;
      file_03.d.d._0_4_ = uVar15;
      file_03.d.ptr = (char16_t *)in_stack_fffffffffffffe50;
      file_03.d.size = (qsizetype)in_stack_fffffffffffffe58;
      local_88.m_string.d.d = local_e0.d;
      fileInfo((MakefileGenerator *)&in_fi_1,file_03);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
      cVar10 = QFileInfo::exists();
      if (cVar10 != '\0') {
        QFileInfo::canonicalFilePath();
        pcVar9 = local_88.m_string.d.ptr;
        pDVar8 = local_88.m_string.d.d;
        local_88.m_string.d.d = (Data *)_in_fi;
        local_88.m_string.d.ptr = (char16_t *)pQStack_190;
        _in_fi = (Data *)pDVar8;
        pQStack_190 = (QMakeProject *)pcVar9;
        local_88.m_string.d.size = (qsizetype)local_188;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&in_fi);
      }
      QFileInfo::~QFileInfo(&in_fi_1);
      cVar10 = QString::endsWith((QChar)(char16_t)&local_88,0x2f);
      if (cVar10 == '\0') {
        QString::append((QChar)(char16_t)&local_88);
      }
      QString::prepend(__return_storage_ptr__,(QString *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    }
LAB_0013eccc:
    pQVar14 = (QArrayDataPointer<char16_t> *)&local_88;
    Option::fixPathToTargetOS((QString *)pQVar14,__return_storage_ptr__,false,canon);
    pDVar3 = (Data *)(__return_storage_ptr__->d).d;
    pQVar17 = (QMakeProject *)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_88.m_string.d.d;
    (__return_storage_ptr__->d).ptr = local_88.m_string.d.ptr;
    pQVar1 = (QMakeLocalFileName *)(__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_88.m_string.d.size;
    local_88.m_string.d.d = (Data *)pDVar3;
    local_88.m_string.d.ptr = (char16_t *)pQVar17;
    local_88.m_string.d.size = (qsizetype)pQVar1;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar14);
  if ((__return_storage_ptr__->d).size == 0) {
    QString::operator=(__return_storage_ptr__,".");
  }
  if (Option::debug_level != 0) {
    QString::toLatin1_helper((QString *)&local_88);
    pQVar17 = (QMakeProject *)local_88.m_string.d.ptr;
    if ((QMakeProject *)local_88.m_string.d.ptr == (QMakeProject *)0x0) {
      pQVar17 = (QMakeProject *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&in_fi);
    if (pQStack_190 == (QMakeProject *)0x0) {
      pQStack_190 = (QMakeProject *)&QByteArray::_empty;
    }
    qmake_getpwd();
    QString::toLatin1_helper_inplace((QString *)&in_fi_1);
    if (pQStack_a0 == (QMakeProject *)0x0) {
      pQStack_a0 = (QMakeProject *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&out_fi);
    if (pSStack_120 == (SourceFiles *)0x0) {
      pSStack_120 = (SourceFiles *)&QByteArray::_empty;
    }
    debug_msg_internal(3,"Fixed[%d,%d] %s :: to :: %s [%s::%s]",(ulong)QVar19.i,(ulong)uVar15,
                       pQVar17,pQStack_190,pQStack_a0,pSStack_120);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&out_fi);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&in_fi_1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&in_fi);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0013f0cb:
  __stack_chk_fail();
code_r0x0013ee9f:
  iVar16 = iVar16 + 1;
  goto LAB_0013edf6;
}

Assistant:

QString
MakefileGenerator::fileFixify(const QString &file, FileFixifyTypes fix, bool canon) const
{
    if(file.isEmpty())
        return file;
    QString ret = file;

    //do the fixin'
    QString orig_file = ret;
    if(ret.startsWith(QLatin1Char('~'))) {
        if(ret.startsWith(QLatin1String("~/")))
            ret = QDir::homePath() + ret.mid(1);
        else
            warn_msg(WarnLogic, "Unable to expand ~ in %s", ret.toLatin1().constData());
    }
    if ((fix & FileFixifyAbsolute)
            || (!(fix & FileFixifyRelative) && project->isActiveConfig("no_fixpath"))) {
        if ((fix & FileFixifyAbsolute) && QDir::isRelativePath(ret)) {
            QString pwd = !(fix & FileFixifyFromOutdir) ? project->projectDir() : Option::output_dir;
            {
                QFileInfo in_fi(fileInfo(pwd));
                if (in_fi.exists())
                    pwd = in_fi.canonicalFilePath();
            }
            if (!pwd.endsWith(QLatin1Char('/')))
                pwd += QLatin1Char('/');
            ret.prepend(pwd);
        }
        ret = Option::fixPathToTargetOS(ret, false, canon);
    } else { //fix it..
        QString out_dir = (fix & FileFixifyToIndir) ? project->projectDir() : Option::output_dir;
        QString in_dir  = !(fix & FileFixifyFromOutdir) ? project->projectDir() : Option::output_dir;
        {
            QFileInfo in_fi(fileInfo(in_dir));
            if(in_fi.exists())
                in_dir = in_fi.canonicalFilePath();
            QFileInfo out_fi(fileInfo(out_dir));
            if(out_fi.exists())
                out_dir = out_fi.canonicalFilePath();
        }

        QString qfile(Option::normalizePath(ret));
        QFileInfo qfileinfo(fileInfo(qfile));
        if(out_dir != in_dir || !qfileinfo.isRelative()) {
            if(qfileinfo.isRelative()) {
                ret = in_dir + "/" + qfile;
                qfileinfo.setFile(ret);
            }
            ret = Option::fixPathToTargetOS(ret, false, canon);
            QString match_dir = Option::fixPathToTargetOS(out_dir, false, canon);
            if(ret == match_dir) {
                ret = "";
            } else if(ret.startsWith(match_dir + Option::dir_sep)) {
                ret = ret.mid(match_dir.size() + Option::dir_sep.size());
            } else {
                //figure out the depth
                int depth = 4;
                if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                   Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                    if(project && !project->isEmpty("QMAKE_PROJECT_DEPTH"))
                        depth = project->first("QMAKE_PROJECT_DEPTH").toInt();
                    else if(Option::mkfile::cachefile_depth != -1)
                        depth = Option::mkfile::cachefile_depth;
                }
                //calculate how much can be removed
                QString dot_prefix;
                for(int i = 1; i <= depth; i++) {
                    int sl = match_dir.lastIndexOf(Option::dir_sep);
                    if(sl == -1)
                        break;
                    match_dir = match_dir.left(sl);
                    if(match_dir.isEmpty())
                        break;
                    if(ret.startsWith(match_dir + Option::dir_sep)) {
                        //concat
                        int remlen = ret.size() - (match_dir.size() + 1);
                        if(remlen < 0)
                            remlen = 0;
                        ret = ret.right(remlen);
                        //prepend
                        for(int o = 0; o < i; o++)
                            dot_prefix += ".." + Option::dir_sep;
                        break;
                    }
                }
                ret.prepend(dot_prefix);
            }
        } else {
            ret = Option::fixPathToTargetOS(ret, false, canon);
        }
    }
    if(ret.isEmpty())
        ret = ".";
    debug_msg(3, "Fixed[%d,%d] %s :: to :: %s [%s::%s]",
              int(fix), canon, orig_file.toLatin1().constData(), ret.toLatin1().constData(),
              qmake_getpwd().toLatin1().constData(), Option::output_dir.toLatin1().constData());
    return ret;
}